

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *
LiteScript::Script::GetInstructionList
          (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
           *__return_storage_ptr__,char *code,ErrorType *err,uint *line_err,uint *col_error)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 local_78 [8];
  String str;
  char *tmp_s;
  int len;
  int i;
  int sv;
  int tmp;
  uint *col_error_local;
  uint *line_err_local;
  ErrorType *err_local;
  char *code_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *list;
  
  std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::vector
            (__return_storage_ptr__);
  iVar1 = Syntax::ReadScript(code,__return_storage_ptr__,err);
  if (iVar1 < 0) {
    *line_err = 0;
    len = 0;
    for (tmp_s._4_4_ = 0; tmp_s._4_4_ < -iVar1; tmp_s._4_4_ = tmp_s._4_4_ + 1) {
      if (code[tmp_s._4_4_] == '\n') {
        *line_err = *line_err + 1;
        len = tmp_s._4_4_ + 1;
      }
    }
    iVar1 = -iVar1 - len;
    uVar3 = (ulong)(iVar1 + 1);
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    str.str.field_2._8_8_ = operator_new__(uVar3);
    memcpy((void *)str.str.field_2._8_8_,code + len,(long)iVar1);
    *(undefined1 *)(str.str.field_2._8_8_ + (long)iVar1) = 0;
    String::String((String *)local_78,(char *)str.str.field_2._8_8_);
    uVar2 = String::GetLength((String *)local_78);
    *col_error = uVar2;
    String::~String((String *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LiteScript::Instruction> LiteScript::Script::GetInstructionList(const char *code, Script::ErrorType &err,
                                                                            unsigned int &line_err,
                                                                            unsigned int &col_error) {
    std::vector<Instruction> list;
    int tmp;
    if ((tmp = LiteScript::Syntax::ReadScript(code, list, err)) < 0) {
        line_err = 0;
        tmp = -tmp;
        int sv = 0;
        for (int i = 0; i < tmp; i++) {
            if (code[i] == '\n') {
                line_err++;
                sv = i + 1;
            }
        }
        int len = tmp - sv;
        char * tmp_s = new char[len + 1];
        memcpy(tmp_s, code + sv, (size_t)len);
        tmp_s[len] = '\0';
        String str(tmp_s);
        col_error = str.GetLength();
    }
    return list;
}